

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O1

uint64_t __thiscall bitfoot::Bitfoot::BishopXO(Bitfoot *this,int sqr)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((uint)sqr < 0x40) {
    uVar2 = (ulong)(uint)sqr;
    uVar5 = this->pc[1] | this->pc[0];
    uVar4 = *(ulong *)(_SOUTH_EAST + uVar2 * 8) & uVar5;
    if (uVar4 == 0) {
      uVar4 = 0;
    }
    else {
      lVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar4 = *(ulong *)(_BITMAP + (uint)((int)lVar1 << 3));
    }
    uVar3 = *(ulong *)(_SOUTH_WEST + uVar2 * 8) & uVar5;
    if (uVar3 == 0) {
      uVar3 = 0;
    }
    else {
      lVar1 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar3 = *(ulong *)(_BITMAP + (uint)((int)lVar1 << 3));
    }
    uVar6 = uVar5 & *(ulong *)(_NORTH_EAST + uVar2 * 8);
    uVar6 = -uVar6 & uVar6;
    uVar5 = uVar5 & *(ulong *)(_NORTH_WEST + uVar2 * 8);
    uVar5 = -uVar5 & uVar5;
    return (-(ulong)(uVar3 == 0) | -uVar3 ^ uVar3) & *(ulong *)(_SOUTH_WEST + uVar2 * 8) |
           (-(ulong)(uVar4 == 0) | -uVar4 ^ uVar4) & *(ulong *)(_SOUTH_EAST + uVar2 * 8) | uVar5 |
           uVar6 | uVar4 |
           uVar6 - 1 & *(ulong *)(_NORTH_EAST + uVar2 * 8) |
           uVar5 - 1 & *(ulong *)(_NORTH_WEST + uVar2 * 8) | uVar3;
  }
  __assert_fail("IS_SQUARE(sqr)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                ,0x243,"uint64_t bitfoot::Bitfoot::BishopXO(const int) const");
}

Assistant:

inline uint64_t BishopXO(const int sqr) const {
    assert(IS_SQUARE(sqr));
    return (NorthEastXO(sqr) | NorthWestXO(sqr) |
            SouthEastXO(sqr) | SouthWestXO(sqr));
  }